

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenStructReader(SwiftGenerator *this,StructDef *struct_def)

{
  FieldDef *s;
  bool bVar1;
  Value *pVVar2;
  char *__s;
  ulong uVar3;
  reference ppFVar4;
  char *local_818;
  bool local_73a;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670;
  string local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  allocator<char> local_609;
  string local_608;
  string local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  string local_560;
  allocator<char> local_539;
  string local_538;
  FieldDef *local_518;
  FieldDef *field_1;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_508;
  const_iterator it_1;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_390 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> base_value;
  char *accessing_value;
  allocator<char> local_341;
  undefined1 local_340 [8];
  string valueType;
  string local_318;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  undefined1 local_288 [8];
  string type;
  string field_var;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_238;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  main_constructor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  base_constructor;
  undefined1 local_1f8 [8];
  string constructor;
  int padding_id;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  StructDef *pSStack_18;
  bool is_private_access;
  StructDef *struct_def_local;
  SwiftGenerator *this_local;
  
  local_42 = 0;
  local_55 = 0;
  local_73a = true;
  pSStack_18 = struct_def;
  struct_def_local = (StructDef *)this;
  if (((((this->super_BaseGenerator).parser_)->opts).swift_implementation_only & 1U) == 0) {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"private",&local_41);
    local_55 = 1;
    pVVar2 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(struct_def->super_Definition).attributes,&local_40);
    local_73a = pVVar2 != (Value *)0x0;
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  local_19 = local_73a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"ACCESS_TYPE",&local_79);
  __s = "public";
  if ((local_19 & 1) != 0) {
    __s = "internal";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,__s,&local_a1);
  CodeWriter::SetValue(&this->code_,&local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  GenComment(this,&(pSStack_18->super_Definition).doc_comment);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"STRUCTNAME",&local_c9);
  IdlNamer::NamespacedType_abi_cxx11_(&local_f0,&this->namer_,&pSStack_18->super_Definition);
  CodeWriter::SetValue(&this->code_,&local_c8,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "{{ACCESS_TYPE}} struct {{STRUCTNAME}}: NativeStruct, Verifiable, FlatbuffersInitializable\\"
             ,&local_111);
  CodeWriter::operator+=(&this->code_,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,", NativeObject\\",&local_139);
    CodeWriter::operator+=(&this->code_,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160," {",&local_161);
  CodeWriter::operator+=(&this->code_,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"",&local_189);
  CodeWriter::operator+=(&this->code_,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  Indent(this);
  ValidateFunc_abi_cxx11_(&local_1b0,this);
  CodeWriter::operator+=(&this->code_,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&padding_id,"",(allocator<char> *)(constructor.field_2._M_local_buf + 0xf));
  CodeWriter::operator+=(&this->code_,(string *)&padding_id);
  std::__cxx11::string::~string((string *)&padding_id);
  std::allocator<char>::~allocator((allocator<char> *)(constructor.field_2._M_local_buf + 0xf));
  constructor.field_2._8_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f8,"",
             (allocator<char> *)
             ((long)&base_constructor.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&base_constructor.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&main_constructor.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&it);
  local_238._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(pSStack_18->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(pSStack_18->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_238,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_238);
    s = *ppFVar4;
    if ((s->deprecated & 1U) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_1f8,", ");
      }
      IdlNamer::Variable_abi_cxx11_((string *)((long)&type.field_2 + 8),&this->namer_,s);
      GenType_abi_cxx11_((string *)local_288,this,&(s->value).type,false);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"FIELDVAR",&local_2a9)
      ;
      CodeWriter::SetValue(&this->code_,&local_2a8,(string *)((long)&type.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      bVar1 = IsEnum(&(s->value).type);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d0,"BASEVALUE",&local_2d1);
        GenTypeBasic_abi_cxx11_(&local_2f8,this,&(s->value).type,false);
        CodeWriter::SetValue(&this->code_,&local_2d0,&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,"VALUETYPE",
                 (allocator<char> *)(valueType.field_2._M_local_buf + 0xf));
      CodeWriter::SetValue(&this->code_,&local_318,(string *)local_288);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator((allocator<char> *)(valueType.field_2._M_local_buf + 0xf));
      GenComment(this,&(s->super_Definition).doc_comment);
      bVar1 = IsEnum(&(s->value).type);
      if (bVar1) {
        local_818 = "{{BASEVALUE}}";
      }
      else {
        local_818 = "{{VALUETYPE}}";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_340,local_818,&local_341);
      std::allocator<char>::~allocator(&local_341);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &accessing_value,"private var _{{FIELDVAR}}: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340)
      ;
      CodeWriter::operator+=(&this->code_,(string *)&accessing_value);
      std::__cxx11::string::~string((string *)&accessing_value);
      bVar1 = IsEnum(&(s->value).type);
      base_value.field_2._8_8_ = "";
      if (bVar1) {
        base_value.field_2._8_8_ = ".value";
      }
      bVar1 = IsStruct(&(s->value).type);
      if (bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_390,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288,"()");
      }
      else {
        SwiftConstant_abi_cxx11_((string *)local_390,this,s);
      }
      std::operator+(&local_410,"_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type.field_2 + 8));
      std::operator+(&local_3f0,&local_410," = ");
      std::operator+(&local_3d0,&local_3f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type.field_2 + 8));
      std::operator+(&local_3b0,&local_3d0,(char *)base_value.field_2._8_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&it,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_410);
      std::operator+(&local_470,"_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type.field_2 + 8));
      std::operator+(&local_450,&local_470," = ");
      std::operator+(&local_430,&local_450,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&main_constructor.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_430);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      if (s->padding != 0) {
        GenPadding(this,s,(int *)(constructor.field_2._M_local_buf + 8));
      }
      std::operator+(&local_4b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type.field_2 + 8),": ");
      std::operator+(&local_490,&local_4b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
      ;
      std::__cxx11::string::operator+=((string *)local_1f8,(string *)&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)local_390);
      std::__cxx11::string::~string((string *)local_340);
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_238);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"",&local_4d1);
  CodeWriter::operator+=(&this->code_,&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  BuildStructConstructor(this,pSStack_18);
  BuildObjectConstructor
            (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&it,(string *)local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"",(allocator<char> *)((long)&it_1._M_current + 7));
  BuildObjectConstructor
            (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&main_constructor.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_current + 7));
  if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
    GenerateObjectAPIStructConstructor(this,pSStack_18);
  }
  local_508._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(pSStack_18->fields).vec);
  while( true ) {
    field_1 = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (&(pSStack_18->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_508,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field_1);
    if (!bVar1) break;
    ppFVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_508);
    local_518 = *ppFVar4;
    if ((local_518->deprecated & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"FIELDVAR",&local_539)
      ;
      IdlNamer::Variable_abi_cxx11_(&local_560,&this->namer_,local_518);
      CodeWriter::SetValue(&this->code_,&local_538,&local_560);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator(&local_539);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_580,"VALUETYPE",&local_581);
      GenType_abi_cxx11_(&local_5a8,this,&(local_518->value).type,false);
      CodeWriter::SetValue(&this->code_,&local_580,&local_5a8);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_580);
      std::allocator<char>::~allocator(&local_581);
      GenComment(this,&(local_518->super_Definition).doc_comment);
      bVar1 = IsEnum(&(local_518->value).type);
      if (bVar1) {
        bVar1 = IsEnum(&(local_518->value).type);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"",&local_671);
          GenReaderMainBody(&local_650,this,&local_670);
          std::operator+(&local_630,&local_650,"{{VALUETYPE}}(rawValue: _{{FIELDVAR}})! }");
          CodeWriter::operator+=(&this->code_,&local_630);
          std::__cxx11::string::~string((string *)&local_630);
          std::__cxx11::string::~string((string *)&local_650);
          std::__cxx11::string::~string((string *)&local_670);
          std::allocator<char>::~allocator(&local_671);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"",&local_609);
        GenReaderMainBody(&local_5e8,this,&local_608);
        std::operator+(&local_5c8,&local_5e8,"_{{FIELDVAR}} }");
        CodeWriter::operator+=(&this->code_,&local_5c8);
        std::__cxx11::string::~string((string *)&local_5c8);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::__cxx11::string::~string((string *)&local_608);
        std::allocator<char>::~allocator(&local_609);
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_508);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"",&local_699);
  CodeWriter::operator+=(&this->code_,&local_698);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,
             "{{ACCESS_TYPE}} static func verify<T>(_ verifier: inout Verifier, at position: Int, of type: T.Type) throws where T: Verifiable {"
             ,&local_6c1);
  CodeWriter::operator+=(&this->code_,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  Indent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,
             "try verifier.inBuffer(position: position, of: {{STRUCTNAME}}.self)",&local_6e9);
  CodeWriter::operator+=(&this->code_,&local_6e8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  Outdent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"}",&local_711);
  CodeWriter::operator+=(&this->code_,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  Outdent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"}\n",&local_739);
  CodeWriter::operator+=(&this->code_,&local_738);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  if (((((this->super_BaseGenerator).parser_)->opts).gen_json_coders & 1U) != 0) {
    GenerateJSONEncodingAPIs(this,pSStack_18);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&it);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&main_constructor.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_1f8);
  return;
}

Assistant:

void GenStructReader(const StructDef &struct_def) {
    const bool is_private_access =
        parser_.opts.swift_implementation_only ||
        struct_def.attributes.Lookup("private") != nullptr;
    code_.SetValue("ACCESS_TYPE", is_private_access ? "internal" : "public");
    GenComment(struct_def.doc_comment);
    code_.SetValue("STRUCTNAME", namer_.NamespacedType(struct_def));
    code_ +=
        "{{ACCESS_TYPE}} struct {{STRUCTNAME}}: NativeStruct, Verifiable, "
        "FlatbuffersInitializable\\";
    if (parser_.opts.generate_object_based_api) code_ += ", NativeObject\\";
    code_ += " {";
    code_ += "";
    Indent();
    code_ += ValidateFunc();
    code_ += "";
    int padding_id = 0;
    std::string constructor = "";
    std::vector<std::string> base_constructor;
    std::vector<std::string> main_constructor;

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;

      if (!constructor.empty()) constructor += ", ";

      const auto field_var = namer_.Variable(field);
      const auto type = GenType(field.value.type);
      code_.SetValue("FIELDVAR", field_var);
      if (IsEnum(field.value.type)) {
        code_.SetValue("BASEVALUE", GenTypeBasic(field.value.type, false));
      }
      code_.SetValue("VALUETYPE", type);
      GenComment(field.doc_comment);
      std::string valueType =
          IsEnum(field.value.type) ? "{{BASEVALUE}}" : "{{VALUETYPE}}";
      code_ += "private var _{{FIELDVAR}}: " + valueType;
      const auto accessing_value = IsEnum(field.value.type) ? ".value" : "";
      const auto base_value =
          IsStruct(field.value.type) ? (type + "()") : SwiftConstant(field);

      main_constructor.push_back("_" + field_var + " = " + field_var +
                                 accessing_value);
      base_constructor.push_back("_" + field_var + " = " + base_value);

      if (field.padding) { GenPadding(field, &padding_id); }
      constructor += field_var + ": " + type;
    }
    code_ += "";
    BuildStructConstructor(struct_def);
    BuildObjectConstructor(main_constructor, constructor);
    BuildObjectConstructor(base_constructor, "");

    if (parser_.opts.generate_object_based_api)
      GenerateObjectAPIStructConstructor(struct_def);

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      code_.SetValue("FIELDVAR", namer_.Variable(field));
      code_.SetValue("VALUETYPE", GenType(field.value.type));
      GenComment(field.doc_comment);
      if (!IsEnum(field.value.type)) {
        code_ += GenReaderMainBody() + "_{{FIELDVAR}} }";
      } else if (IsEnum(field.value.type)) {
        code_ +=
            GenReaderMainBody() + "{{VALUETYPE}}(rawValue: _{{FIELDVAR}})! }";
      }
    }
    code_ += "";
    code_ +=
        "{{ACCESS_TYPE}} static func verify<T>(_ verifier: inout Verifier, at "
        "position: "
        "Int, of type: T.Type) throws where T: Verifiable {";
    Indent();
    code_ +=
        "try verifier.inBuffer(position: position, of: {{STRUCTNAME}}.self)";
    Outdent();
    code_ += "}";
    Outdent();
    code_ += "}\n";
    if (parser_.opts.gen_json_coders) GenerateJSONEncodingAPIs(struct_def);
  }